

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O3

void helics::addOperations(Filter *filt,FilterTypes type,Core *param_3)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  shared_ptr<helics::DelayFilterOperation> operation;
  undefined1 local_89;
  FirewallFilterOperation *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  shared_ptr<helics::FilterOperations> local_78;
  shared_ptr<helics::FilterOperations> local_68;
  shared_ptr<helics::FilterOperations> local_58;
  shared_ptr<helics::FilterOperations> local_48;
  shared_ptr<helics::FilterOperations> local_38;
  shared_ptr<helics::FilterOperations> local_28;
  
  switch(type) {
  case DELAY:
    local_88 = (FirewallFilterOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::DelayFilterOperation,std::allocator<helics::DelayFilterOperation>>
              (&_Stack_80,(DelayFilterOperation **)&local_88,
               (allocator<helics::DelayFilterOperation> *)&local_89);
    local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_FilterOperations;
    local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    local_88 = (FirewallFilterOperation *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_38);
    this._M_pi = local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    break;
  case RANDOM_DELAY:
    local_88 = (FirewallFilterOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::RandomDelayFilterOperation,std::allocator<helics::RandomDelayFilterOperation>>
              (&_Stack_80,(RandomDelayFilterOperation **)&local_88,
               (allocator<helics::RandomDelayFilterOperation> *)&local_89);
    local_28.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_FilterOperations;
    local_28.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    local_88 = (FirewallFilterOperation *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_28);
    this._M_pi = local_28.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    break;
  case RANDOM_DROP:
    local_88 = (FirewallFilterOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::RandomDropFilterOperation,std::allocator<helics::RandomDropFilterOperation>>
              (&_Stack_80,(RandomDropFilterOperation **)&local_88,
               (allocator<helics::RandomDropFilterOperation> *)&local_89);
    local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_FilterOperations;
    local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    local_88 = (FirewallFilterOperation *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_48);
    this._M_pi = local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    break;
  case REROUTE:
    local_88 = (FirewallFilterOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::RerouteFilterOperation,std::allocator<helics::RerouteFilterOperation>>
              (&_Stack_80,(RerouteFilterOperation **)&local_88,
               (allocator<helics::RerouteFilterOperation> *)&local_89);
    local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_FilterOperations;
    local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    local_88 = (FirewallFilterOperation *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_58);
    this._M_pi = local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    break;
  case CLONE:
    local_88 = (FirewallFilterOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::CloneFilterOperation,std::allocator<helics::CloneFilterOperation>>
              (&_Stack_80,(CloneFilterOperation **)&local_88,
               (allocator<helics::CloneFilterOperation> *)&local_89);
    local_68.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_FilterOperations;
    local_68.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    local_88 = (FirewallFilterOperation *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_68);
    this._M_pi = local_68.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    break;
  case FIREWALL:
    local_88 = (FirewallFilterOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::FirewallFilterOperation,std::allocator<helics::FirewallFilterOperation>>
              (&_Stack_80,&local_88,(allocator<helics::FirewallFilterOperation> *)&local_89);
    local_78.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88->super_FilterOperations;
    local_78.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    local_88 = (FirewallFilterOperation *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_78);
    this._M_pi = local_78.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    break;
  default:
    goto switchD_00208ccb_default;
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_pi);
  }
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_80._M_pi);
  }
switchD_00208ccb_default:
  return;
}

Assistant:

void addOperations(Filter* filt, FilterTypes type, Core* /*cptr*/)
{
    switch (type) {
        case FilterTypes::CUSTOM:
        default:
            break;
        case FilterTypes::RANDOM_DELAY: {
            auto operation = std::make_shared<RandomDelayFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::DELAY: {
            auto operation = std::make_shared<DelayFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::RANDOM_DROP: {
            auto operation = std::make_shared<RandomDropFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::REROUTE: {
            auto operation = std::make_shared<RerouteFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::CLONE: {
            auto operation = std::make_shared<CloneFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::FIREWALL: {
            auto operation = std::make_shared<FirewallFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
    }
}